

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

char * __thiscall Json::Value::asCString(Value *this)

{
  Value *local_1d0;
  char *this_str;
  undefined1 local_1c0 [4];
  uint this_len;
  ostringstream local_190 [8];
  ostringstream oss;
  Value *this_local;
  
  if ((*(ushort *)&this->field_0x8 & 0xff) != 4) {
    std::__cxx11::ostringstream::ostringstream(local_190);
    std::operator<<((ostream *)local_190,"in Json::Value::asCString(): requires stringValue");
    std::__cxx11::ostringstream::str();
    throwLogicError((string *)local_1c0);
  }
  if ((this->value_).int_ == 0) {
    this_local = (Value *)0x0;
  }
  else {
    decodePrefixedString
              ((*(ushort *)&this->field_0x8 >> 8 & 1) != 0,(this->value_).string_,
               (uint *)((long)&this_str + 4),(char **)&local_1d0);
    this_local = local_1d0;
  }
  return (char *)this_local;
}

Assistant:

const char* Value::asCString() const {
  JSON_ASSERT_MESSAGE(type_ == stringValue,
                      "in Json::Value::asCString(): requires stringValue");
  if (value_.string_ == 0) return 0;
  unsigned this_len;
  char const* this_str;
  decodePrefixedString(this->allocated_, this->value_.string_, &this_len, &this_str);
  return this_str;
}